

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

int __thiscall
Signal<std::shared_ptr<Reaction>_>::Connect
          (Signal<std::shared_ptr<Reaction>_> *this,function<void_(std::shared_ptr<Reaction>)> *slot
          )

{
  pair<int,_std::function<void_(std::shared_ptr<Reaction>)>_> local_40;
  function<void_(std::shared_ptr<Reaction>)> *local_18;
  function<void_(std::shared_ptr<Reaction>)> *slot_local;
  Signal<std::shared_ptr<Reaction>_> *this_local;
  
  this->current_id_ = this->current_id_ + 1;
  local_18 = slot;
  slot_local = (function<void_(std::shared_ptr<Reaction>)> *)this;
  std::make_pair<int&,std::function<void(std::shared_ptr<Reaction>)>const&>
            (&local_40,&this->current_id_,slot);
  std::
  map<int,std::function<void(std::shared_ptr<Reaction>)>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>>
  ::insert<std::pair<int,std::function<void(std::shared_ptr<Reaction>)>>>
            ((map<int,std::function<void(std::shared_ptr<Reaction>)>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>>
              *)this,&local_40);
  std::pair<int,_std::function<void_(std::shared_ptr<Reaction>)>_>::~pair(&local_40);
  return this->current_id_;
}

Assistant:

int Connect(std::function<void(Args...)> const &slot) const {
    slots_.insert(std::make_pair(++current_id_, slot));
    return current_id_;
  }